

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::BinaryExpr<const_unsigned_long_&,_const_int_&>::streamReconstructedExpression
          (BinaryExpr<const_unsigned_long_&,_const_int_&> *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  string *in_R9;
  long in_FS_OFFSET;
  StringRef op;
  string sStack_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  Detail::stringify<unsigned_long>(&local_48,this->m_lhs);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  Detail::stringify<int>(&sStack_68,this->m_rhs);
  op.m_size = (size_type)&sStack_68;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_48,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }